

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O0

void raviH_set_float(lua_State *L,RaviArray *t,lua_Unsigned u1,lua_Number value)

{
  uint uVar1;
  int iVar2;
  lua_Number *data;
  uint u;
  lua_Number value_local;
  lua_Unsigned u1_local;
  RaviArray *t_local;
  lua_State *L_local;
  
  uVar1 = (uint)u1;
  if ((t->flags & 8) == 0) {
    __assert_fail("t->flags & RAVI_ARRAY_ISFLOAT",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.c"
                  ,0x374,"void raviH_set_float(lua_State *, RaviArray *, lua_Unsigned, lua_Number)")
    ;
  }
  if (t->len <= uVar1) {
    if (uVar1 != t->len) {
      luaG_runerror(L,"array out of bounds");
    }
    if ((t->size <= uVar1) && (iVar2 = ravi_resize_array(L,t,0,1), iVar2 == 0)) {
      luaG_runerror(L,"array cannot be resized");
    }
    t->len = t->len + 1;
  }
  *(lua_Number *)(t->data + (u1 & 0xffffffff) * 8) = value;
  return;
}

Assistant:

void raviH_set_float(lua_State *L, RaviArray *t, lua_Unsigned u1, lua_Number value) {
  unsigned int u = (unsigned int)u1;
  lua_assert(t->flags & RAVI_ARRAY_ISFLOAT);
  lua_Number *data;
  if (u < t->len) {
  setval2:
    data = (lua_Number *)t->data;
    data[u] = value;
  } else if (u == t->len) {
    if (u < t->size) {
    setval:
      t->len++;
      goto setval2;
    } else {
      if (ravi_resize_array(L, t, 0, 1))
        goto setval;
      else
        luaG_runerror(L, "array cannot be resized");
    }
  } else
    luaG_runerror(L, "array out of bounds");
}